

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# analyser.cpp
# Opt level: O0

void __thiscall Analyser::analyse_parameter_clause(Analyser *this)

{
  bool bVar1;
  TokenType TVar2;
  Token *pTVar3;
  Error *pEVar4;
  allocator<char> local_289;
  string local_288;
  undefined1 local_262;
  allocator<char> local_261;
  string local_260;
  optional<Token> local_240;
  optional<Token> local_218;
  undefined1 local_1f0 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e0;
  undefined1 local_1ba;
  allocator<char> local_1b9;
  string local_1b8;
  optional<Token> local_198;
  char local_169;
  undefined1 local_168 [7];
  char type_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_158;
  undefined1 local_132;
  allocator<char> local_131;
  string local_130;
  optional<Token> local_110;
  char local_e1;
  undefined1 local_e0 [7];
  char type;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  undefined1 local_b0 [8];
  vector<char,_std::allocator<char>_> paramTypes;
  allocator<char> local_69;
  string local_68;
  undefined1 local_38 [8];
  optional<Token> next;
  Analyser *this_local;
  
  next.super__Optional_base<Token,_false,_false>._M_payload.
  super__Optional_payload<Token,_true,_false,_false>.super__Optional_payload_base<Token>._32_8_ =
       this;
  nextToken((optional<Token> *)local_38,this);
  bVar1 = std::optional<Token>::has_value((optional<Token> *)local_38);
  if (bVar1) {
    pTVar3 = std::optional<Token>::value((optional<Token> *)local_38);
    TVar2 = Token::GetType(pTVar3);
    if (TVar2 == LEFT_BRACKET) {
      nextToken((optional<Token> *)
                &paramTypes.super__Vector_base<char,_std::allocator<char>_>._M_impl.field_0x10,this)
      ;
      std::optional<Token>::operator=
                ((optional<Token> *)local_38,
                 (optional<Token> *)
                 &paramTypes.super__Vector_base<char,_std::allocator<char>_>._M_impl.field_0x10);
      std::optional<Token>::~optional
                ((optional<Token> *)
                 &paramTypes.super__Vector_base<char,_std::allocator<char>_>._M_impl.field_0x10);
      std::vector<char,_std::allocator<char>_>::vector
                ((vector<char,_std::allocator<char>_> *)local_b0);
      do {
        bVar1 = std::optional<Token>::has_value((optional<Token> *)local_38);
        if (!bVar1) {
LAB_0012aeb2:
          addFunctionParameter(this,(vector<char,_std::allocator<char>_> *)local_b0);
          bVar1 = std::optional<Token>::has_value((optional<Token> *)local_38);
          if (bVar1) {
            pTVar3 = std::optional<Token>::value((optional<Token> *)local_38);
            TVar2 = Token::GetType(pTVar3);
            if (TVar2 == RIGHT_BRACKET) {
              std::vector<char,_std::allocator<char>_>::~vector
                        ((vector<char,_std::allocator<char>_> *)local_b0);
              std::optional<Token>::~optional((optional<Token> *)local_38);
              return;
            }
          }
          pEVar4 = (Error *)__cxa_allocate_exception(0x28);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_288,"Missing \')\'",&local_289);
          Error::Error(pEVar4,&local_288,(long)this->_currentLine);
          __cxa_throw(pEVar4,&Error::typeinfo,Error::~Error);
        }
        pTVar3 = std::optional<Token>::value((optional<Token> *)local_38);
        TVar2 = Token::GetType(pTVar3);
        if (TVar2 != RESERVED_WORD) goto LAB_0012aeb2;
        std::optional<Token>::value((optional<Token> *)local_38);
        Token::GetValue((Token *)local_e0);
        std::any_cast<std::__cxx11::string>(&local_d0,(any *)local_e0);
        bVar1 = std::operator==(&local_d0,"const");
        std::__cxx11::string::~string((string *)&local_d0);
        std::any::~any((any *)local_e0);
        if (bVar1) {
          local_e1 = analyse_type_specifier(this);
          std::vector<char,std::allocator<char>>::emplace_back<char&>
                    ((vector<char,std::allocator<char>> *)local_b0,&local_e1);
          nextToken(&local_110,this);
          std::optional<Token>::operator=((optional<Token> *)local_38,&local_110);
          std::optional<Token>::~optional(&local_110);
          bVar1 = std::optional<Token>::has_value((optional<Token> *)local_38);
          if (!bVar1) {
LAB_0012a8eb:
            local_132 = 1;
            pEVar4 = (Error *)__cxa_allocate_exception(0x28);
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_130,"Missing <identifier>",&local_131);
            Error::Error(pEVar4,&local_130,(long)this->_currentLine);
            local_132 = 0;
            __cxa_throw(pEVar4,&Error::typeinfo,Error::~Error);
          }
          pTVar3 = std::optional<Token>::value((optional<Token> *)local_38);
          TVar2 = Token::GetType(pTVar3);
          if (TVar2 != IDENTIFIER) goto LAB_0012a8eb;
          std::optional<Token>::value((optional<Token> *)local_38);
          Token::GetValue((Token *)local_168);
          std::any_cast<std::__cxx11::string>(&local_158,(any *)local_168);
          addVariable(this,&local_158,true);
          std::__cxx11::string::~string((string *)&local_158);
          std::any::~any((any *)local_168);
        }
        else {
          unreadToken(this);
          local_169 = analyse_type_specifier(this);
          std::vector<char,std::allocator<char>>::emplace_back<char&>
                    ((vector<char,std::allocator<char>> *)local_b0,&local_169);
          nextToken(&local_198,this);
          std::optional<Token>::operator=((optional<Token> *)local_38,&local_198);
          std::optional<Token>::~optional(&local_198);
          bVar1 = std::optional<Token>::has_value((optional<Token> *)local_38);
          if (!bVar1) {
LAB_0012ab62:
            local_1ba = 1;
            pEVar4 = (Error *)__cxa_allocate_exception(0x28);
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_1b8,"Missing <identifier>",&local_1b9);
            Error::Error(pEVar4,&local_1b8,(long)this->_currentLine);
            local_1ba = 0;
            __cxa_throw(pEVar4,&Error::typeinfo,Error::~Error);
          }
          pTVar3 = std::optional<Token>::value((optional<Token> *)local_38);
          TVar2 = Token::GetType(pTVar3);
          if (TVar2 != IDENTIFIER) goto LAB_0012ab62;
          std::optional<Token>::value((optional<Token> *)local_38);
          Token::GetValue((Token *)local_1f0);
          std::any_cast<std::__cxx11::string>
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     (local_1f0 + 0x10),(any *)local_1f0);
          addVariable(this,(string *)(local_1f0 + 0x10),false);
          std::__cxx11::string::~string((string *)(local_1f0 + 0x10));
          std::any::~any((any *)local_1f0);
        }
        nextToken(&local_218,this);
        std::optional<Token>::operator=((optional<Token> *)local_38,&local_218);
        std::optional<Token>::~optional(&local_218);
        bVar1 = std::optional<Token>::has_value((optional<Token> *)local_38);
        if (!bVar1) goto LAB_0012aeb2;
        pTVar3 = std::optional<Token>::value((optional<Token> *)local_38);
        TVar2 = Token::GetType(pTVar3);
        if (TVar2 != COMMA_SIGH) goto LAB_0012aeb2;
        nextToken(&local_240,this);
        std::optional<Token>::operator=((optional<Token> *)local_38,&local_240);
        std::optional<Token>::~optional(&local_240);
        bVar1 = std::optional<Token>::has_value((optional<Token> *)local_38);
        if (!bVar1) break;
        pTVar3 = std::optional<Token>::value((optional<Token> *)local_38);
        TVar2 = Token::GetType(pTVar3);
      } while (TVar2 == RESERVED_WORD);
      local_262 = 1;
      pEVar4 = (Error *)__cxa_allocate_exception(0x28);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_260,"Missing <identifier>",&local_261);
      Error::Error(pEVar4,&local_260,(long)this->_currentLine);
      local_262 = 0;
      __cxa_throw(pEVar4,&Error::typeinfo,Error::~Error);
    }
  }
  pEVar4 = (Error *)__cxa_allocate_exception(0x28);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_68,"Missing \'(\'",&local_69);
  Error::Error(pEVar4,&local_68,(long)this->_currentLine);
  __cxa_throw(pEVar4,&Error::typeinfo,Error::~Error);
}

Assistant:

void Analyser::analyse_parameter_clause() {
	auto next = nextToken();
	if (!next.has_value() || next.value().GetType() != TokenType::LEFT_BRACKET) {
		throw Error("Missing '('", _currentLine);
	}
	//<parameter-declaration>
	next = nextToken();
	std::vector<char> paramTypes;
	while (true) {
		if (!next.has_value() || next.value().GetType() != TokenType::RESERVED_WORD) {
			break;
		}
		//const
		if (std::any_cast<std::string>(next.value().GetValue()) == "const") {
			char type = analyse_type_specifier();
			paramTypes.emplace_back(type);
			//<identifier>
			next = nextToken();
			if (!next.has_value() || (next.value().GetType() != TokenType::IDENTIFIER)) {
				throw Error("Missing <identifier>", _currentLine);
			}
			addVariable(std::any_cast<std::string>(next.value().GetValue()), true);
		}
		//non-const
		else {
			unreadToken();
			char type = analyse_type_specifier();
			paramTypes.emplace_back(type);
			next = nextToken();
			if (!next.has_value() || (next.value().GetType() != TokenType::IDENTIFIER)) {
				throw Error("Missing <identifier>", _currentLine);
			}
			addVariable(std::any_cast<std::string>(next.value().GetValue()), false);
		}
		//','
		next = nextToken();
		if (!next.has_value() || next.value().GetType() != TokenType::COMMA_SIGH) {
			break;
		}
		//Ԥ���ж��Ƿ�Ϊfunc(int a ,)���ִ�������
		next = nextToken();
		if (!next.has_value() || next.value().GetType() != TokenType::RESERVED_WORD) {
			throw Error("Missing <identifier>", _currentLine);
		}
	}
	addFunctionParameter(paramTypes);
	if (!next.has_value() || next.value().GetType() != TokenType::RIGHT_BRACKET) {
		throw Error("Missing ')'", _currentLine);
	}
}